

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<char>::relocate(QArrayDataPointer<char> *this,qsizetype offset,char **data)

{
  bool bVar1;
  char *first;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<char> *in_RDI;
  char **unaff_retaddr;
  char *res;
  QArrayDataPointer<char> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<char,long_long>(first,(longlong)in_RDI,(char *)0x13a9e0);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::q_points_into_range<QArrayDataPointer<char>,char_const*>(unaff_retaddr,c),
     bVar1)) {
    *in_RDX = in_RSI + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }